

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vwdll.cpp
# Opt level: O0

void VW_CopyModelData(VW_HANDLE handle,VW_IOBUF *outputBufferHandle,char **outputData,
                     size_t *outputSize)

{
  io_buf *buf_00;
  _func_int **pp_Var1;
  char *pcVar2;
  memory_io_buf *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  memory_io_buf *buf;
  vw *pointer;
  vw *in_stack_ffffffffffffffc0;
  
  buf_00 = (io_buf *)operator_new(200);
  memory_io_buf::memory_io_buf(in_RCX);
  VW::save_predictor(in_stack_ffffffffffffffc0,buf_00);
  *in_RSI = buf_00;
  pp_Var1 = (_func_int **)memory_io_buf::GetDataSize((memory_io_buf *)0x1a62fc);
  (in_RCX->super_io_buf)._vptr_io_buf = pp_Var1;
  pcVar2 = memory_io_buf::GetDataPointer((memory_io_buf *)0x1a6311);
  *in_RDX = pcVar2;
  return;
}

Assistant:

VW_DLL_MEMBER void VW_CALLING_CONV VW_CopyModelData(VW_HANDLE handle, VW_IOBUF* outputBufferHandle, char** outputData, size_t* outputSize) {
    vw* pointer = static_cast<vw*>(handle);

    memory_io_buf* buf = new(memory_io_buf);
    VW::save_predictor(*pointer, *buf);

    *outputBufferHandle = buf;
    *outputSize = buf->GetDataSize();
    *outputData = buf->GetDataPointer();
}